

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeGetEstLocalErrors(void *arkode_mem,N_Vector ele)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x847;
  }
  else {
    if (*(code **)((long)arkode_mem + 0xf8) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0xf8))();
      return iVar1;
    }
    msgfmt = "time-stepping module does provide a temporal error estimate";
    error_code = -0x30;
    iVar1 = 0x854;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeGetEstLocalErrors",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeGetEstLocalErrors(void* arkode_mem, N_Vector ele)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Call stepper-specific routine (if provided); otherwise return an error */
  if (ark_mem->step_getestlocalerrors)
  {
    return (ark_mem->step_getestlocalerrors(ark_mem, ele));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does provide a temporal error estimate");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}